

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SortedRun.cpp
# Opt level: O3

void __thiscall SortedRun::do_or(SortedRun *this,SortedRun *other)

{
  pointer puVar1;
  pointer puVar2;
  pointer puVar3;
  pointer local_38;
  pointer puStack_30;
  pointer local_28;
  
  decompress(this);
  decompress(other);
  local_38 = (pointer)0x0;
  puStack_30 = (pointer)0x0;
  local_28 = (pointer)0x0;
  validate_compression(other,false);
  puVar1 = (other->sequence_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  validate_compression(other,false);
  puVar2 = (other->sequence_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  validate_compression(this,false);
  puVar3 = (this->sequence_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_start;
  validate_compression(this,false);
  std::
  __set_union<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (puVar1,puVar2,puVar3,
             (this->sequence_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish,&local_38);
  puVar1 = (this->sequence_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_start;
  puVar2 = (this->sequence_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_finish;
  puVar3 = (this->sequence_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_end_of_storage;
  (this->sequence_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = local_38;
  (this->sequence_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = puStack_30;
  (this->sequence_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_28;
  if (puVar1 != (pointer)0x0) {
    local_38 = puVar1;
    puStack_30 = puVar2;
    local_28 = puVar3;
    operator_delete(puVar1,(long)puVar3 - (long)puVar1);
  }
  return;
}

Assistant:

void SortedRun::do_or(SortedRun &other) {
    // In almost every case this is already decompressed.
    decompress();
    other.decompress();
    std::vector<FileId> new_results;
    std::set_union(other.begin(), other.end(), begin(), end(),
                   std::back_inserter(new_results));
    std::swap(new_results, sequence_);
}